

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void arm_cpu_do_interrupt_aarch32_qemu(CPUState *cs)

{
  _Bool _Var1;
  uint32_t uVar2;
  CPUARMState_conflict *env_00;
  TranslationBlock *pTVar3;
  int local_58;
  TranslationBlock *local_50;
  uint local_34;
  uint32_t local_30;
  uint32_t moe;
  uint32_t offset;
  int new_mode;
  uint32_t mask;
  uint32_t addr;
  CPUARMState_conflict *env;
  ARMCPU_conflict1 *cpu;
  CPUState *cs_local;
  
  env_00 = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  uVar2 = syn_get_ec(*(uint32_t *)(cs[1].tb_jmp_cache + 0x585));
  switch(uVar2) {
  case 0x30:
  case 0x31:
    local_34 = 1;
    break;
  default:
    local_34 = 0;
    break;
  case 0x34:
  case 0x35:
    local_34 = 10;
    break;
  case 0x38:
    local_34 = 3;
    break;
  case 0x3a:
    local_34 = 5;
  }
  if (local_34 != 0) {
    pTVar3 = (TranslationBlock *)deposit64((uint64_t)cs[1].tb_jmp_cache[0x508],2,4,(ulong)local_34);
    cs[1].tb_jmp_cache[0x508] = pTVar3;
  }
  if (*(int *)(cs[1].tb_jmp_cache + 0x587) == 2) {
    arm_cpu_do_interrupt_aarch32_hyp(cs);
  }
  else {
    switch(cs->exception_index) {
    case 1:
      moe = 0x1b;
      new_mode = 4;
      offset = 0x80;
      if (*(int *)(cs[1].tb_jmp_cache + 0x44f) == 0) {
        local_30 = 4;
      }
      else {
        local_30 = 2;
      }
      break;
    case 2:
      moe = 0x13;
      new_mode = 8;
      offset = 0x80;
      local_30 = 0;
      break;
    case 3:
    case 7:
      _Var1 = arm_is_secure(env_00);
      if ((!_Var1) || (_Var1 = arm_el_is_aa64(env_00,3), _Var1)) {
        cs[1].tb_jmp_cache[0x484] =
             (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c);
      }
      else {
        cs[1].tb_jmp_cache[0x485] =
             (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c);
      }
      _Var1 = arm_is_secure(env_00);
      if ((!_Var1) || (_Var1 = arm_el_is_aa64(env_00,3), _Var1)) {
        *(int *)((long)cs[1].tb_jmp_cache + 0x247c) = (int)cs[1].tb_jmp_cache[0x586];
      }
      else {
        *(int *)((long)cs[1].tb_jmp_cache + 0x2484) = (int)cs[1].tb_jmp_cache[0x586];
      }
      moe = 0x17;
      new_mode = 0xc;
      offset = 0x180;
      local_30 = 4;
      break;
    case 4:
      _Var1 = arm_is_secure(env_00);
      if ((!_Var1) || (_Var1 = arm_el_is_aa64(env_00,3), _Var1)) {
        cs[1].tb_jmp_cache[0x487] =
             (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c);
      }
      else {
        cs[1].tb_jmp_cache[0x489] =
             (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c);
      }
      _Var1 = arm_is_secure(env_00);
      if ((!_Var1) || (_Var1 = arm_el_is_aa64(env_00,3), _Var1)) {
        *(int *)(cs[1].tb_jmp_cache + 0x48f) = (int)cs[1].tb_jmp_cache[0x586];
      }
      else {
        *(int *)(cs[1].tb_jmp_cache + 0x490) = (int)cs[1].tb_jmp_cache[0x586];
      }
      moe = 0x17;
      new_mode = 0x10;
      offset = 0x180;
      local_30 = 8;
      break;
    case 5:
      moe = 0x12;
      new_mode = 0x18;
      offset = 0x180;
      local_30 = 4;
      if (((ulong)cs[1].tb_jmp_cache[0x483] & 2) != 0) {
        moe = 0x16;
        offset = 0x1c0;
      }
      break;
    case 6:
      moe = 0x11;
      new_mode = 0x1c;
      offset = 0x1c0;
      if (((ulong)cs[1].tb_jmp_cache[0x483] & 4) != 0) {
        moe = 0x16;
      }
      local_30 = 4;
      break;
    default:
      cpu_abort_aarch64(cs,"Unhandled exception 0x%x\n",(ulong)(uint)cs->exception_index);
    case 0xd:
      moe = 0x16;
      new_mode = 8;
      offset = 0x1c0;
      local_30 = 0;
      break;
    case 0xe:
      moe = 0x12;
      new_mode = 0x18;
      offset = 0x180;
      local_30 = 4;
      break;
    case 0xf:
      moe = 0x11;
      new_mode = 0x1c;
      offset = 0x1c0;
      local_30 = 4;
    }
    if (moe == 0x16) {
      new_mode = *(int *)(cs[1].tb_jmp_cache + 0x4a7) + new_mode;
    }
    else {
      _Var1 = arm_is_secure(env_00);
      if ((!_Var1) || (_Var1 = arm_el_is_aa64(env_00,3), _Var1)) {
        local_50 = cs[1].tb_jmp_cache[0x460];
      }
      else {
        local_50 = cs[1].tb_jmp_cache[0x462];
      }
      if (((ulong)local_50 & 0x2000) == 0) {
        _Var1 = arm_is_secure(env_00);
        if ((!_Var1) || (_Var1 = arm_el_is_aa64(env_00,3), _Var1)) {
          local_58 = (int)cs[1].tb_jmp_cache[0x4a4];
        }
        else {
          local_58 = (int)cs[1].tb_jmp_cache[0x4a6];
        }
        new_mode = new_mode + local_58;
      }
      else {
        new_mode = new_mode + -0x10000;
      }
    }
    if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f) == 0x16) {
      cs[1].tb_jmp_cache[0x483] =
           (TranslationBlock *)((ulong)cs[1].tb_jmp_cache[0x483] & 0xfffffffe);
    }
    take_aarch32_exception(env_00,moe,offset,local_30,new_mode);
  }
  return;
}

Assistant:

static void arm_cpu_do_interrupt_aarch32_qemu(CPUState *cs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    uint32_t addr;
    uint32_t mask;
    int new_mode;
    uint32_t offset;
    uint32_t moe;

    /* If this is a debug exception we must update the DBGDSCR.MOE bits */
    switch (syn_get_ec(env->exception.syndrome)) {
    case EC_BREAKPOINT:
    case EC_BREAKPOINT_SAME_EL:
        moe = 1;
        break;
    case EC_WATCHPOINT:
    case EC_WATCHPOINT_SAME_EL:
        moe = 10;
        break;
    case EC_AA32_BKPT:
        moe = 3;
        break;
    case EC_VECTORCATCH:
        moe = 5;
        break;
    default:
        moe = 0;
        break;
    }

    if (moe) {
        env->cp15.mdscr_el1 = deposit64(env->cp15.mdscr_el1, 2, 4, moe);
    }

    if (env->exception.target_el == 2) {
        arm_cpu_do_interrupt_aarch32_hyp(cs);
        return;
    }

    switch (cs->exception_index) {
    case EXCP_UDEF:
        new_mode = ARM_CPU_MODE_UND;
        addr = 0x04;
        mask = CPSR_I;
        if (env->thumb)
            offset = 2;
        else
            offset = 4;
        break;
    case EXCP_SWI:
        new_mode = ARM_CPU_MODE_SVC;
        addr = 0x08;
        mask = CPSR_I;
        /* The PC already points to the next instruction.  */
        offset = 0;
        break;
    case EXCP_BKPT:
        /* Fall through to prefetch abort.  */
    case EXCP_PREFETCH_ABORT:
        A32_BANKED_CURRENT_REG_SET(env, ifsr, env->exception.fsr);
        A32_BANKED_CURRENT_REG_SET(env, ifar, env->exception.vaddress);
        qemu_log_mask(CPU_LOG_INT, "...with IFSR 0x%x IFAR 0x%x\n",
                      env->exception.fsr, (uint32_t)env->exception.vaddress);
        new_mode = ARM_CPU_MODE_ABT;
        addr = 0x0c;
        mask = CPSR_A | CPSR_I;
        offset = 4;
        break;
    case EXCP_DATA_ABORT:
        A32_BANKED_CURRENT_REG_SET(env, dfsr, env->exception.fsr);
        A32_BANKED_CURRENT_REG_SET(env, dfar, env->exception.vaddress);
        qemu_log_mask(CPU_LOG_INT, "...with DFSR 0x%x DFAR 0x%x\n",
                      env->exception.fsr,
                      (uint32_t)env->exception.vaddress);
        new_mode = ARM_CPU_MODE_ABT;
        addr = 0x10;
        mask = CPSR_A | CPSR_I;
        offset = 8;
        break;
    case EXCP_IRQ:
        new_mode = ARM_CPU_MODE_IRQ;
        addr = 0x18;
        /* Disable IRQ and imprecise data aborts.  */
        mask = CPSR_A | CPSR_I;
        offset = 4;
        if (env->cp15.scr_el3 & SCR_IRQ) {
            /* IRQ routed to monitor mode */
            new_mode = ARM_CPU_MODE_MON;
            mask |= CPSR_F;
        }
        break;
    case EXCP_FIQ:
        new_mode = ARM_CPU_MODE_FIQ;
        addr = 0x1c;
        /* Disable FIQ, IRQ and imprecise data aborts.  */
        mask = CPSR_A | CPSR_I | CPSR_F;
        if (env->cp15.scr_el3 & SCR_FIQ) {
            /* FIQ routed to monitor mode */
            new_mode = ARM_CPU_MODE_MON;
        }
        offset = 4;
        break;
    case EXCP_VIRQ:
        new_mode = ARM_CPU_MODE_IRQ;
        addr = 0x18;
        /* Disable IRQ and imprecise data aborts.  */
        mask = CPSR_A | CPSR_I;
        offset = 4;
        break;
    case EXCP_VFIQ:
        new_mode = ARM_CPU_MODE_FIQ;
        addr = 0x1c;
        /* Disable FIQ, IRQ and imprecise data aborts.  */
        mask = CPSR_A | CPSR_I | CPSR_F;
        offset = 4;
        break;
    case EXCP_SMC:
        new_mode = ARM_CPU_MODE_MON;
        addr = 0x08;
        mask = CPSR_A | CPSR_I | CPSR_F;
        offset = 0;
        break;
    default:
        cpu_abort(cs, "Unhandled exception 0x%x\n", cs->exception_index);
        return; /* Never happens.  Keep compiler happy.  */
    }

    if (new_mode == ARM_CPU_MODE_MON) {
        addr += env->cp15.mvbar;
    } else if (A32_BANKED_CURRENT_REG_GET(env, sctlr) & SCTLR_V) {
        /* High vectors. When enabled, base address cannot be remapped. */
        addr += 0xffff0000;
    } else {
        /* ARM v7 architectures provide a vector base address register to remap
         * the interrupt vector table.
         * This register is only followed in non-monitor mode, and is banked.
         * Note: only bits 31:5 are valid.
         */
        addr += A32_BANKED_CURRENT_REG_GET(env, vbar);
    }

    if ((env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_MON) {
        env->cp15.scr_el3 &= ~SCR_NS;
    }

    take_aarch32_exception(env, new_mode, mask, offset, addr);
}